

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.h
# Opt level: O3

void __thiscall HEkk::~HEkk(HEkk *this)

{
  if (*(void **)(this + 0x3898) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3898));
  }
  if (*(void **)(this + 0x3880) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3880));
  }
  if (*(void **)(this + 0x3830) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3830));
  }
  if (*(void **)(this + 0x3818) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3818));
  }
  if (*(void **)(this + 0x3800) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3800));
  }
  if (*(void **)(this + 0x37e8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x37e8));
  }
  if (*(void **)(this + 0x37d0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x37d0));
  }
  if (*(void **)(this + 0x37b8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x37b8));
  }
  if (*(void **)(this + 0x37a0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x37a0));
  }
  if (*(void **)(this + 0x3770) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3770));
  }
  if (*(void **)(this + 0x3750) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3750));
  }
  if (*(void **)(this + 0x3730) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3730));
  }
  if (*(void **)(this + 0x3718) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3718));
  }
  if (*(void **)(this + 0x36c8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x36c8));
  }
  if (*(void **)(this + 0x36a8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x36a8));
  }
  if (*(void **)(this + 0x3690) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3690));
  }
  if (*(void **)(this + 0x3678) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x3678));
  }
  HSimplexNla::~HSimplexNla((HSimplexNla *)(this + 0x2b38));
  if (*(void **)(this + 0x2b20) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2b20));
  }
  if (*(void **)(this + 0x2b08) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2b08));
  }
  if (*(void **)(this + 0x2af0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2af0));
  }
  if (*(void **)(this + 0x2ad8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2ad8));
  }
  if (*(void **)(this + 0x2ab0) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2ab0));
  }
  if (*(void **)(this + 0x2a98) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a98));
  }
  if (*(void **)(this + 0x2a80) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a80));
  }
  if (*(void **)(this + 0x2a68) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a68));
  }
  if (*(void **)(this + 0x2a38) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a38));
  }
  if (*(void **)(this + 0x2a20) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2a20));
  }
  HighsHashTable<unsigned_long,_void>::~HighsHashTable
            ((HighsHashTable<unsigned_long,_void> *)(this + 0x29f0));
  if (*(HEkk **)(this + 0x29d0) != this + 0x29e0) {
    operator_delete(*(HEkk **)(this + 0x29d0));
  }
  if (*(void **)(this + 0x29a8) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x29a8));
  }
  if (*(void **)(this + 0x2990) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2990));
  }
  if (*(void **)(this + 0x2978) != (void *)0x0) {
    operator_delete(*(void **)(this + 0x2978));
  }
  HighsSimplexInfo::~HighsSimplexInfo((HighsSimplexInfo *)(this + 0x2560));
  if (*(HEkk **)(this + 0x2530) != this + 0x2540) {
    operator_delete(*(HEkk **)(this + 0x2530));
  }
  HighsLp::~HighsLp((HighsLp *)(this + 0x2198));
  HighsSimplexAnalysis::~HighsSimplexAnalysis((HighsSimplexAnalysis *)(this + 0x18));
  return;
}

Assistant:

HEkk()
      : callback_(nullptr),
        options_(nullptr),
        timer_(nullptr),
        lp_name_(""),
        model_status_(HighsModelStatus::kNotset),
        simplex_in_scaled_space_(false),
        cost_scale_(1.0),
        cost_perturbation_base_(0.0),
        cost_perturbation_max_abs_cost_(0.0),
        iteration_count_(0),
        dual_simplex_cleanup_level_(0),
        dual_simplex_phase1_cleanup_level_(0),
        previous_iteration_cycling_detected(-kHighsIInf),
        solve_bailout_(false),
        called_return_from_solve_(false),
        exit_algorithm_(SimplexAlgorithm::kNone),
        return_primal_solution_status_(0),
        return_dual_solution_status_(0),
        original_num_col_(0),
        original_num_row_(0),
        original_num_nz_(0),
        original_offset_(0.0),
        edge_weight_error_(0.0),
        build_synthetic_tick_(0.0),
        total_synthetic_tick_(0.0),
        debug_solve_call_num_(0),
        debug_basis_id_(0),
        time_report_(false),
        debug_initial_build_synthetic_tick_(0),
        debug_solve_report_(false),
        debug_iteration_report_(false),
        debug_basis_report_(false),
        debug_dual_feasible(false),
        debug_max_relative_dual_steepest_edge_weight_error(0) {}